

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# typebuilder.cc
# Opt level: O1

void __thiscall Typelib::TypeBuilder::addPointer(TypeBuilder *this,int level)

{
  Registry *pRVar1;
  Type *new_type;
  string local_70;
  string local_50;
  
  if (level != 0) {
    do {
      pRVar1 = this->m_registry;
      Type::getName_abi_cxx11_(&local_50,this->m_type);
      Pointer::getPointerName(&local_70,&local_50);
      new_type = Registry::get_(pRVar1,&local_70);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._M_dataplus._M_p != &local_70.field_2) {
        operator_delete(local_70._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p);
      }
      if (new_type == (Type *)0x0) {
        new_type = (Type *)operator_new(0x48);
        Pointer::Pointer((Pointer *)new_type,this->m_type);
        pRVar1 = this->m_registry;
        local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"");
        Registry::add(pRVar1,new_type,&local_70);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_70._M_dataplus._M_p != &local_70.field_2) {
          operator_delete(local_70._M_dataplus._M_p);
        }
      }
      this->m_type = new_type;
      level = level + -1;
    } while (level != 0);
  }
  return;
}

Assistant:

void TypeBuilder::addPointer(int level)
    {
        for (; level; --level)
        {
            // Try to get the type object in the registry
            Type* base_type = m_registry.get_(Pointer::getPointerName(m_type->getName()));
            if (base_type)
                m_type = base_type;
            else
            {
                Type* new_type = new Pointer(*m_type);
                m_registry.add(new_type);
                m_type = new_type;
            }
        }
    }